

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

void nn_bipc_destroy(nn_epbase *self)

{
  nn_usock *self_00;
  nn_ctx **self_01;
  int iVar1;
  uint uVar2;
  nn_fsm *pnVar3;
  nn_ctx *ctx;
  ulong extraout_RAX;
  nn_list_item *pnVar4;
  nn_list_item *pnVar5;
  char *__s;
  size_t sVar6;
  nn_aipc *pnVar7;
  nn_aipc *in_RCX;
  uint *puVar8;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint uVar9;
  uint extraout_EDX_03;
  long *in_RSI;
  long *plVar10;
  nn_list *self_02;
  nn_bipc *pnVar11;
  nn_fsm *pnVar12;
  nn_aipc *unaff_R15;
  sockaddr sStack_128;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  nn_fsm *pnStack_a0;
  nn_fsm *pnStack_98;
  nn_aipc *pnStack_90;
  code *pcStack_88;
  nn_bipc *pnStack_80;
  nn_list *pnStack_78;
  nn_aipc *pnStack_70;
  nn_aipc *pnStack_68;
  undefined1 auStack_38 [8];
  nn_list nStack_30;
  
  pnVar3 = (nn_fsm *)(self + -6);
  if (self == (nn_epbase *)0x0) {
    pnVar3 = (nn_fsm *)0x0;
  }
  self_02 = (nn_list *)(ulong)*(uint *)&pnVar3[1].fn;
  if (*(uint *)&pnVar3[1].fn == 1) {
    self_02 = (nn_list *)&pnVar3[8].ctx;
    nn_list_term(self_02);
    if (pnVar3[8].owner == (nn_fsm *)0x0) {
      nn_usock_term((nn_usock *)&pnVar3[1].srcptr);
      nn_backoff_term((nn_backoff *)&pnVar3[8].stopped.src);
      nn_epbase_term((nn_epbase *)&pnVar3[1].shutdown_fn);
      nn_fsm_term(pnVar3);
      nn_free(pnVar3);
      return;
    }
  }
  else {
    nn_bipc_destroy_cold_1();
  }
  nn_bipc_destroy_cold_2();
  pnVar11 = (nn_bipc *)0x3f0;
  plVar10 = in_RSI;
  nStack_30.last = (nn_list_item *)pnVar3;
  pnVar3 = (nn_fsm *)nn_alloc_(0x3f0);
  iVar1 = (int)plVar10;
  if (pnVar3 == (nn_fsm *)0x0) {
    nn_bipc_create_cold_3();
LAB_0012a9bf:
    nn_bipc_create_cold_1();
  }
  else {
    unaff_R15 = (nn_aipc *)&pnVar3[1].shutdown_fn;
    nn_epbase_init((nn_epbase *)unaff_R15,&nn_bipc_epbase_vfptr,self_02);
    ctx = nn_epbase_getctx((nn_epbase *)unaff_R15);
    nn_fsm_init_root(pnVar3,nn_bipc_handler,nn_bipc_shutdown,ctx);
    *(undefined4 *)&pnVar3[1].fn = 1;
    self_02 = &nStack_30;
    nStack_30.first = (nn_list_item *)0x4;
    in_RCX = (nn_aipc *)(auStack_38 + 4);
    iVar1 = 0;
    pnVar11 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,6,in_RCX,(size_t *)self_02);
    if (nStack_30.first != (nn_list_item *)0x4) goto LAB_0012a9bf;
    self_02 = &nStack_30;
    nStack_30.first = (nn_list_item *)0x4;
    in_RCX = (nn_aipc *)auStack_38;
    iVar1 = 0;
    pnVar11 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,7,in_RCX,(size_t *)self_02);
    if (nStack_30.first == (nn_list_item *)0x4) {
      if (auStack_38._0_4_ == 0) {
        auStack_38._0_4_ = auStack_38._4_4_;
      }
      nn_backoff_init((nn_backoff *)&pnVar3[8].stopped.src,3,auStack_38._4_4_,auStack_38._0_4_,
                      pnVar3);
      nn_usock_init((nn_usock *)&pnVar3[1].srcptr,1,pnVar3);
      pnVar3[8].owner = (nn_fsm *)0x0;
      nn_list_init((nn_list *)&pnVar3[8].ctx);
      nn_fsm_start(pnVar3);
      *in_RSI = (long)unaff_R15;
      return;
    }
  }
  nn_bipc_create_cold_2();
  puVar8 = &switchD_0012a9f1::switchdataD_00134fa4;
  uVar2 = extraout_EDX;
  switch(pnVar11->state) {
  case 1:
    if (iVar1 == -2) {
      if (extraout_EDX == 0xfffffffe) goto LAB_0012aa1a;
      nn_bipc_handler_cold_11();
      uVar2 = extraout_EDX_00;
      goto switchD_0012a9f1_caseD_9;
    }
LAB_0012ab47:
    nn_bipc_handler_cold_10();
    break;
  case 2:
    unaff_R15 = pnVar11->aipc;
    if (unaff_R15 == in_RCX) {
      if (extraout_EDX == 0x85b7) {
        pnVar4 = nn_list_end(&pnVar11->aipcs);
        nn_list_insert(&pnVar11->aipcs,&unaff_R15->item,pnVar4);
        pnVar11->aipc = (nn_aipc *)0x0;
        nn_bipc_start_accepting(pnVar11);
        return;
      }
      goto LAB_0012ab6a;
    }
    if (iVar1 != 2) {
      nn_bipc_handler_cold_7();
      goto LAB_0012ab2c;
    }
    if (extraout_EDX == 0x85b9) {
      nn_list_erase(&pnVar11->aipcs,&in_RCX->item);
      nn_aipc_term(in_RCX);
      nn_free(in_RCX);
      return;
    }
    uVar2 = 2;
    uVar9 = extraout_EDX;
    if (extraout_EDX == 0x85b8) {
      nn_aipc_stop(in_RCX);
      return;
    }
    goto LAB_0012ab73;
  default:
    goto switchD_0012a9f1_caseD_3;
  case 7:
    if (iVar1 != 3) goto LAB_0012ab35;
    if (extraout_EDX == 1) {
      nn_backoff_stop(&pnVar11->retry);
      pnVar11->state = 9;
      return;
    }
    goto LAB_0012ab57;
  case 8:
    if (iVar1 != 1) goto LAB_0012ab3e;
    if (extraout_EDX == 8) {
      return;
    }
    if (extraout_EDX == 7) {
      nn_backoff_start(&pnVar11->retry);
      pnVar11->state = 7;
      return;
    }
    goto LAB_0012ab63;
  case 9:
switchD_0012a9f1_caseD_9:
    if (iVar1 != 3) {
LAB_0012ab2c:
      nn_bipc_handler_cold_1();
LAB_0012ab35:
      nn_bipc_handler_cold_3();
LAB_0012ab3e:
      nn_bipc_handler_cold_5();
      goto LAB_0012ab47;
    }
    if (uVar2 == 2) {
LAB_0012aa1a:
      nn_bipc_start_listening(pnVar11);
      return;
    }
  }
  nn_bipc_handler_cold_2();
LAB_0012ab57:
  nn_bipc_handler_cold_4();
switchD_0012a9f1_caseD_3:
  nn_bipc_handler_cold_12();
LAB_0012ab63:
  nn_bipc_handler_cold_6();
  uVar2 = extraout_EDX_01;
LAB_0012ab6a:
  nn_bipc_handler_cold_9();
  uVar9 = extraout_EDX_02;
LAB_0012ab73:
  pnVar3 = (nn_fsm *)(ulong)uVar2;
  nn_bipc_handler_cold_8();
  pnStack_80 = pnVar11;
  pnStack_78 = self_02;
  pnStack_70 = in_RCX;
  pnStack_68 = unaff_R15;
  if (extraout_EDX_03 == 0xfffffffd && uVar9 == 0xfffffffe) goto LAB_0012abc2;
  while( true ) {
    pnVar12 = pnVar3 + 1;
    if (*(int *)&pnVar3[1].fn == 3) {
      pcStack_88 = (code *)0x12abd7;
      nn_bipc_shutdown_cold_2();
      if ((extraout_RAX & 1) != 0) {
        return;
      }
    }
    uVar2 = *(uint *)&pnVar12->fn;
    pnVar11 = (nn_bipc *)(ulong)uVar2;
    if (uVar2 == 4) {
      pcStack_88 = (code *)0x12abe9;
      iVar1 = nn_usock_isidle((nn_usock *)&pnVar3[1].srcptr);
      if (iVar1 == 0) {
        return;
      }
      pcStack_88 = (code *)0x12abfd;
      iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar3[8].stopped.src);
      if (iVar1 == 0) {
        return;
      }
      self_01 = &pnVar3[8].ctx;
      pcStack_88 = (code *)0x12ac14;
      pnVar4 = nn_list_begin((nn_list *)self_01);
      while( true ) {
        pcStack_88 = (code *)0x12ac1f;
        pnVar5 = nn_list_end((nn_list *)self_01);
        if (pnVar4 == pnVar5) break;
        pnVar7 = (nn_aipc *)(pnVar4 + -0x73);
        if (pnVar4 == (nn_list_item *)0x0) {
          pnVar7 = (nn_aipc *)0x0;
        }
        pcStack_88 = (code *)0x12ac38;
        nn_aipc_stop(pnVar7);
        pcStack_88 = (code *)0x12ac43;
        pnVar4 = nn_list_next((nn_list *)self_01,pnVar4);
      }
      *(undefined4 *)&pnVar12->fn = 5;
      goto LAB_0012ac7f;
    }
    if (uVar2 == 5) break;
    pcStack_88 = (code *)0x12abc2;
    nn_bipc_shutdown_cold_4();
LAB_0012abc2:
    pcStack_88 = (code *)0x12abca;
    nn_bipc_shutdown_cold_1();
  }
  if ((uVar9 == 2) && (extraout_EDX_03 == 0x85b9)) {
    pcStack_88 = (code *)0x12ac66;
    nn_list_erase((nn_list *)&pnVar3[8].ctx,&((nn_aipc *)puVar8)->item);
    pcStack_88 = (code *)0x12ac6e;
    nn_aipc_term((nn_aipc *)puVar8);
    pcStack_88 = (code *)0x12ac76;
    nn_free(puVar8);
LAB_0012ac7f:
    pcStack_88 = (code *)0x12ac8b;
    iVar1 = nn_list_empty((nn_list *)&pnVar3[8].ctx);
    if (iVar1 == 0) {
      return;
    }
    *(undefined4 *)&pnVar3[1].fn = 1;
    pcStack_88 = (code *)0x12ac9e;
    nn_fsm_stopped_noevent(pnVar3);
    nn_epbase_stopped((nn_epbase *)&pnVar3[1].shutdown_fn);
    return;
  }
  pcStack_88 = nn_bipc_start_listening;
  nn_bipc_shutdown_cold_3();
  pnStack_a0 = pnVar3;
  pnStack_98 = pnVar12;
  pnStack_90 = (nn_aipc *)puVar8;
  pcStack_88 = (code *)(ulong)extraout_EDX_03;
  __s = nn_epbase_getaddr(&pnVar11->epbase);
  sStack_128.sa_family = 0;
  sStack_128.sa_data[0] = '\0';
  sStack_128.sa_data[1] = '\0';
  sStack_128.sa_data[2] = '\0';
  sStack_128.sa_data[3] = '\0';
  sStack_128.sa_data[4] = '\0';
  sStack_128.sa_data[5] = '\0';
  sStack_128.sa_data[6] = '\0';
  sStack_128.sa_data[7] = '\0';
  sStack_128.sa_data[8] = '\0';
  sStack_128.sa_data[9] = '\0';
  sStack_128.sa_data[10] = '\0';
  sStack_128.sa_data[0xb] = '\0';
  sStack_128.sa_data[0xc] = '\0';
  sStack_128.sa_data[0xd] = '\0';
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  sVar6 = strlen(__s);
  if (0x6b < sVar6) {
    nn_bipc_start_listening_cold_4();
    goto LAB_0012ae2b;
  }
  sStack_128.sa_family = 1;
  strncpy(sStack_128.sa_data,__s,0x6c);
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
LAB_0012adb7:
    self_00 = &pnVar11->usock;
    iVar1 = nn_usock_start(self_00,1,1,0);
    if (-1 < iVar1) {
      iVar1 = nn_usock_bind(self_00,&sStack_128,0x6e);
      if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,10), -1 < iVar1)) {
        nn_bipc_start_accepting(pnVar11);
        pnVar11->state = 2;
        return;
      }
      nn_usock_stop(self_00);
      pnVar11->state = 8;
      return;
    }
LAB_0012ae2b:
    nn_backoff_start(&pnVar11->retry);
    pnVar11->state = 7;
    return;
  }
  iVar1 = fcntl(uVar2,4,0x800);
  if (iVar1 == -1) {
    puVar8 = (uint *)__errno_location();
    pnVar3 = (nn_fsm *)(ulong)*puVar8;
    if (*puVar8 == 0x16) goto LAB_0012ad6f;
  }
  else {
LAB_0012ad6f:
    iVar1 = connect(uVar2,(sockaddr *)&sStack_128,0x6e);
    if ((((iVar1 == -1) && (puVar8 = (uint *)__errno_location(), *puVar8 == 0x6f)) &&
        (iVar1 = unlink(__s), iVar1 != 0)) && (pnVar3 = (nn_fsm *)(ulong)*puVar8, *puVar8 != 2))
    goto LAB_0012ae4d;
    pnVar3 = (nn_fsm *)(ulong)uVar2;
    iVar1 = close(uVar2);
    if (iVar1 == 0) goto LAB_0012adb7;
    nn_bipc_start_listening_cold_3();
  }
  nn_bipc_start_listening_cold_1();
LAB_0012ae4d:
  nn_bipc_start_listening_cold_2();
  if (pnVar3[8].owner == (nn_fsm *)0x0) {
    pnVar12 = (nn_fsm *)0x740;
    pnVar7 = (nn_aipc *)nn_alloc_(0x740);
    pnVar3[8].owner = (nn_fsm *)pnVar7;
    if (pnVar7 != (nn_aipc *)0x0) {
      nn_aipc_init(pnVar7,2,(nn_epbase *)&pnVar3[1].shutdown_fn,pnVar3);
      nn_aipc_start((nn_aipc *)pnVar3[8].owner,(nn_usock *)&pnVar3[1].srcptr);
      return;
    }
  }
  else {
    nn_bipc_start_accepting_cold_1();
    pnVar12 = pnVar3;
  }
  nn_bipc_start_accepting_cold_2();
  if (pnVar12 != (nn_fsm *)0x0) {
    pnVar12 = (nn_fsm *)&pnVar12[-2].stopped.item;
  }
  nn_fsm_stop(pnVar12);
  return;
}

Assistant:

static void nn_bipc_destroy (struct nn_epbase *self)
{
    struct nn_bipc *bipc;

    bipc = nn_cont (self, struct nn_bipc, epbase);

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_backoff_term (&bipc->retry);
    nn_epbase_term (&bipc->epbase);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}